

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::SubroutineUniform::SubroutineUniform
          (SubroutineUniform *this,UniformValueGenerator *generator,
          SubroutineFunctionSet *_functions,Loc _location,int _arraySize,DefOccurence _defOccurence,
          bool _used)

{
  int *__args;
  int iVar1;
  iterator __position;
  pointer pSVar2;
  pointer piVar3;
  pointer pSVar4;
  long lVar5;
  undefined1 local_1b0 [96];
  _Alloc_hider local_150;
  int local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  pair<int,_int> local_130;
  string asStack_128 [32];
  string local_108 [32];
  int local_e8;
  int local_e4;
  GLenum local_e0;
  bool local_dc;
  bool bStack_db;
  UniformType local_d8;
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  local_48;
  
  SubroutineFunctionSet::SubroutineFunctionSet(&this->functions,_functions);
  (this->location).super_LayoutSpecifierBase.val = (int)_location.super_LayoutSpecifierBase._0_8_;
  (this->location).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_location.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  this->arraySize = _arraySize;
  (this->defOccurence).occurence = _defOccurence.occurence;
  this->used = _used;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType((UniformType *)local_1b0,0x1405,0);
  UniformValue::UniformValue(&this->embeddedUIntUniform,(UniformType *)local_1b0,generator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != &local_140) {
    operator_delete(local_150._M_p,(ulong)(local_140._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_1b0._64_8_ != local_1b0 + 0x50) {
    operator_delete((void *)local_1b0._64_8_,local_1b0._80_8_ + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
             *)(local_1b0 + 0x28));
  if ((pointer)local_1b0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b0._8_8_,local_1b0._24_8_ - local_1b0._8_8_);
  }
  __args = &this->arraySize;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  iVar1 = this->arraySize;
  if (-1 < iVar1) {
    if (iVar1 == 0) {
      *__args = 1;
    }
    this->isArray = iVar1 != 0;
    __position._M_current =
         (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->arraySizesSegmented,__position,__args);
    }
    else {
      *__position._M_current = this->arraySize;
      (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    UniformType::UniformType(&local_d8,0x1405,*__args);
    UniformValue::UniformValue((UniformValue *)local_1b0,&local_d8,generator);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&(this->embeddedUIntUniform).fValues,(UniformValue *)local_1b0);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(this->embeddedUIntUniform).iValues,local_1b0 + 0x18);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(this->embeddedUIntUniform).uValues,local_1b0 + 0x30);
    (this->embeddedUIntUniform).type.enumType = local_1b0._72_4_;
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(this->embeddedUIntUniform).type.arraySizesSegmented,local_1b0 + 0x50);
    (this->embeddedUIntUniform).type.arraySize = local_148;
    local_48.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->embeddedUIntUniform).type.childTypes.
         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->embeddedUIntUniform).type.childTypes.
         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->embeddedUIntUniform).type.childTypes.
         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->embeddedUIntUniform).type.childTypes.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_140._M_allocated_capacity;
    (this->embeddedUIntUniform).type.childTypes.
    super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_140._8_8_;
    *(pair<int,_int> *)
     &(this->embeddedUIntUniform).type.childTypes.
      super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_130;
    local_140._M_allocated_capacity = 0;
    local_140._8_8_ = 0;
    local_130.first = 0;
    local_130.second = 0;
    std::
    vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ::~vector(&local_48);
    std::__cxx11::string::operator=((string *)&(this->embeddedUIntUniform).type.strType,asStack_128)
    ;
    std::__cxx11::string::operator=
              ((string *)&(this->embeddedUIntUniform).type.refStrType,local_108);
    (this->embeddedUIntUniform).type.size.first = local_e8;
    (this->embeddedUIntUniform).type.size.second = local_e4;
    (this->embeddedUIntUniform).type.isArray = local_dc;
    (this->embeddedUIntUniform).type.signedType = bStack_db;
    (this->embeddedUIntUniform).type.baseType = local_e0;
    UniformValue::~UniformValue((UniformValue *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.refStrType._M_dataplus._M_p != &local_d8.refStrType.field_2) {
      operator_delete(local_d8.refStrType._M_dataplus._M_p,
                      local_d8.refStrType.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.strType._M_dataplus._M_p != &local_d8.strType.field_2) {
      operator_delete(local_d8.strType._M_dataplus._M_p,
                      local_d8.strType.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ::~vector(&local_d8.childTypes);
    if (local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.arraySizesSegmented.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.arraySizesSegmented.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (0 < *__args) {
      pSVar2 = (this->functions).fn.
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      piVar3 = (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar4 = (this->functions).fn.
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        piVar3[lVar5] =
             (int)((ulong)(long)piVar3[lVar5] %
                  (ulong)(((long)pSVar2 - (long)pSVar4 >> 3) * 0xf83e0f83e0f83e1));
        lVar5 = lVar5 + 1;
      } while (lVar5 < *__args);
    }
    return;
  }
  __assert_fail("arraySize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x32a,
                "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, int, DefOccurence, bool)"
               );
}

Assistant:

SubroutineUniform(UniformValueGenerator& generator, SubroutineFunctionSet& _functions, Loc _location,
					  int _arraySize = 0, DefOccurence _defOccurence = DefOccurence::ALL_SH, bool _used = true)
		: functions(_functions)
		, location(_location)
		, arraySize(_arraySize)
		, defOccurence(_defOccurence)
		, used(_used)
		, embeddedUIntUniform(GL_UNSIGNED_INT, generator)
	{

		assert(arraySize >= 0);

		if (!arraySize)
		{
			arraySize = 1;
			isArray   = false;
		}
		else
		{
			isArray = true;
		}

		arraySizesSegmented.push_back(arraySize);

		embeddedUIntUniform = UniformValue(UniformType(GL_UNSIGNED_INT, arraySize), generator);
		for (int i = 0; i < arraySize; i++)
		{
			embeddedUIntUniform.uValues[i] = static_cast<GLint>(embeddedUIntUniform.uValues[i] % functions.fn.size());
		}
	}